

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<int,_int,_2U>::const_iterator::setToFind(const_iterator *this,int left,int right)

{
  IntervalMap<int,_int,_2U> *pIVar1;
  size_type sVar2;
  pointer pEVar3;
  ulong uVar4;
  interval<int> *piVar5;
  int iVar6;
  LeafNode<int,_int,_3U,_true> *self;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint32_t uVar10;
  ulong uVar11;
  int iVar12;
  uint uStack_3c;
  NodeRef NStack_38;
  
  pIVar1 = this->map;
  if (pIVar1->height != 0) {
    uVar10 = this->map->rootSize;
    if (uVar10 == 0) {
LAB_004f75f5:
      uVar10 = 0;
    }
    else {
      piVar5 = (this->map->field_0).rootLeaf.
               super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_3U>.first + 2;
      iVar6 = 1;
      do {
        if (left <= piVar5->left) {
          if (iVar6 == 1) goto LAB_004f75f5;
          uVar10 = -iVar6;
          goto LAB_004f75fd;
        }
        iVar12 = uVar10 + iVar6;
        iVar6 = iVar6 + -1;
        piVar5 = piVar5 + 1;
      } while (iVar12 != 2);
      uVar10 = uVar10 - 1;
    }
LAB_004f75fd:
    setRoot(this,uVar10);
    sVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    if ((sVar2 != 0) &&
       (pEVar3 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                 data_, pEVar3->offset < pEVar3->size)) {
      iVar6 = (int)sVar2;
      uVar7 = iVar6 - 1;
      NStack_38.pip.value =
           *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
            ((long)pEVar3[uVar7].node + (ulong)pEVar3[uVar7].offset * 8);
      iVar6 = this->map->height - iVar6;
      if (iVar6 != 0) {
        do {
          uVar11 = (ulong)NStack_38.pip.value & 0xffffffffffffffc0;
          uVar7 = SUB84(NStack_38.pip.value,0) & 0x3f;
          iVar12 = uVar7 + 1;
          lVar9 = 0;
          do {
            if (left <= *(int *)(uVar11 + 0x60 + lVar9 * 8)) {
              iVar12 = (int)lVar9;
              break;
            }
            lVar9 = lVar9 + 1;
          } while ((ulong)uVar7 + 1 != lVar9);
          uStack_3c = iVar12 - 1;
          if (iVar12 == 0) {
            uStack_3c = 0;
          }
          uVar4 = (ulong)uStack_3c;
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
          emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
                     &NStack_38,&uStack_3c);
          NStack_38.pip.value =
               *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)(uVar11 + uVar4 * 8);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar7 = SUB84(NStack_38.pip.value,0) & 0x3f;
      uStack_3c = uVar7 + 1;
      lVar9 = 0;
      do {
        if (left <= *(int *)(((ulong)NStack_38.pip.value & 0xffffffffffffffc0) + lVar9 * 8)) {
          uStack_3c = (uint)lVar9;
          break;
        }
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar7 + 1 != lVar9);
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&NStack_38,
                 &uStack_3c);
    }
    return;
  }
  uVar8 = (ulong)pIVar1->rootSize;
  uVar4 = 0;
  uVar11 = uVar4;
  if (uVar8 != 0) {
    do {
      uVar11 = uVar4;
      if (left <= *(int *)((long)&pIVar1->field_0 + uVar4 * 8)) break;
      uVar4 = uVar4 + 1;
      uVar11 = uVar8;
    } while (uVar8 != uVar4);
  }
  setRoot(this,(uint32_t)uVar11);
  return;
}

Assistant:

bool isFlat() const {
        SLANG_ASSERT(map);
        return map->isFlat();
    }